

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O0

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double> *this)

{
  bool bVar1;
  char *message;
  floating_point<long_double> *in_R9;
  longdouble lVar2;
  AssertionHelper local_250;
  Fixed local_210;
  floating_point<long_double> local_88;
  floating_point<long_double> local_78;
  undefined1 local_60 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict1 b;
  TypeParam_conflict1 a;
  iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double> *this_local;
  
  lVar2 = -(longdouble)FloatingpointTest<long_double>::ONE._0_10_;
  stack0xffffffffffffffc8 = (longdouble)FloatingpointTest<long_double>::ZERO._0_10_;
  iutest::detail::AlwaysZero();
  iutest::floating_point<long_double>::floating_point(&local_78,lVar2 / stack0xffffffffffffffc8);
  iutest::floating_point<long_double>::NINF();
  iutest::internal::backward::EqHelper<false>::Compare<iutest::floating_point<long_double>>
            ((AssertionResult *)local_60,(EqHelper<false> *)"FloatType(a/b)","FloatType::NINF()",
             (char *)&local_78,&local_88,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    message = iutest::AssertionResult::message((AssertionResult *)local_60);
    iutest::AssertionHelper::AssertionHelper
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x50,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_250,&local_210);
    iutest::AssertionHelper::~AssertionHelper(&local_250);
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}